

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu580.c
# Opt level: O0

void save_to_file(char *name,void *ptr,size_t size)

{
  FILE *__s;
  FILE *fp;
  size_t size_local;
  void *ptr_local;
  char *name_local;
  
  __s = fopen(name,"w+b");
  if (__s == (FILE *)0x0) {
    _mpp_log_l(2,"hal_h265e_v580","create file %s failed\n",(char *)0x0,name);
  }
  else {
    fwrite(ptr,1,size,__s);
    fclose(__s);
  }
  return;
}

Assistant:

void save_to_file(char *name, void *ptr, size_t size)
{
    FILE *fp = fopen(name, "w+b");
    if (fp) {
        fwrite(ptr, 1, size, fp);
        fclose(fp);
    } else
        mpp_err("create file %s failed\n", name);
}